

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raii_event_tests.cpp
# Opt level: O2

void __thiscall raii_event_tests::raii_event_order::raii_event_order(raii_event_order *this)

{
  long lVar1;
  TestOpts opts;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  opts.coins_db_in_memory = true;
  opts.block_tree_db_in_memory = true;
  opts.setup_net = true;
  opts.setup_validation_interface = true;
  opts._28_4_ = in_stack_ffffffffffffffe4 & 0xffffff00;
  BasicTestingSetup::BasicTestingSetup(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,MAIN,opts);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(raii_event_order)
{
    event_set_mem_functions(tag_malloc, realloc, tag_free);

    void* base_ptr = nullptr;
    void* event_ptr = nullptr;
    {
        auto base = obtain_event_base();
        auto event = obtain_event(base.get(), -1, 0, nullptr, nullptr);

        base_ptr = (void*)base.get();
        event_ptr = (void*)event.get();

        // base should have allocated before event
        BOOST_CHECK(orders[base_ptr] < orders[event_ptr]);
    }
    // base should be freed after event
    BOOST_CHECK(orders[base_ptr] > orders[event_ptr]);

    event_set_mem_functions(malloc, realloc, free);
}